

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O3

void brotli::CreateBackwardReferences<brotli::HashLongestMatch<14,5,4>>
               (size_t num_bytes,size_t position,bool is_last,uint8_t *ringbuffer,
               size_t ringbuffer_mask,int quality,int lgwin,HashLongestMatch<14,_5,_4> *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  ushort uVar1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  size_t insertlen;
  long lVar13;
  size_t best_len;
  ulong local_f0;
  Command *local_e8;
  uint8_t *local_e0;
  long local_d8;
  ulong local_d0;
  double best_score;
  size_t best_dist;
  size_t best_len_code;
  size_t local_b0;
  double best_score_2;
  size_t best_dist_2;
  size_t best_len_code_2;
  ulong local_90;
  ulong local_88;
  uint8_t *local_80;
  long local_78;
  ulong local_70;
  long local_68;
  size_t local_60;
  long local_58;
  long local_50;
  Command cmd;
  
  if ((num_bytes < 0x101 && is_last) && position == 0) {
    if (num_bytes == 0) goto LAB_0016bb6f;
    sVar3 = 0;
    do {
      hasher->num_[(uint)(*(int *)(ringbuffer + sVar3) * 0x1e35a7bd) >> 0x12] = 0;
      hasher->need_init_ = false;
      sVar3 = sVar3 + 1;
    } while (num_bytes != sVar3);
  }
  else if (hasher->need_init_ == true) {
    memset(hasher,0,0x8000);
    hasher->need_init_ = false;
  }
  if (2 < position && 2 < num_bytes) {
    uVar5 = (uint)(*(int *)(ringbuffer + (position - 3 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x12;
    uVar1 = hasher->num_[uVar5];
    *(int *)((long)hasher->buckets_[0] + (ulong)(uVar1 & 0x1f) * 4 + (ulong)(uVar5 << 7)) =
         (int)(position - 3);
    hasher->num_[uVar5] = uVar1 + 1;
    uVar5 = (uint)(*(int *)(ringbuffer + (position - 2 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x12;
    uVar1 = hasher->num_[uVar5];
    *(int *)((long)hasher->buckets_[0] + (ulong)(uVar1 & 0x1f) * 4 + (ulong)(uVar5 << 7)) =
         (int)(position - 2);
    hasher->num_[uVar5] = uVar1 + 1;
    uVar5 = (uint)(*(int *)(ringbuffer + (position - 1 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x12;
    uVar1 = hasher->num_[uVar5];
    *(int *)((long)hasher->buckets_[0] + (ulong)(uVar1 & 0x1f) * 4 + (ulong)(uVar5 << 7)) =
         (int)(position - 1);
    hasher->num_[uVar5] = uVar1 + 1;
  }
LAB_0016bb6f:
  sVar3 = *last_insert_len;
  uVar8 = ringbuffer_mask & position;
  local_f0 = num_bytes + uVar8;
  local_68 = 0x200;
  if (quality < 9) {
    local_68 = 0x40;
  }
  if (uVar8 + 3 < local_f0) {
    local_d0 = (ulong)((1 << ((byte)lgwin & 0x1f)) + -0x10);
    lVar11 = position - uVar8;
    uVar12 = local_68 + uVar8;
    local_70 = (ulong)(uint)((int)local_68 * 4);
    local_88 = local_f0 - 3;
    local_90 = local_f0 - 4;
    local_d8 = lVar11 + 1;
    local_58 = (uVar8 - 1) + num_bytes;
    local_78 = lVar11 + 2;
    local_80 = ringbuffer + 2;
    local_e8 = commands;
    uVar4 = uVar8;
    local_e0 = ringbuffer;
    local_b0 = ringbuffer_mask;
    do {
      uVar8 = lVar11 + uVar4;
      uVar6 = local_d0;
      if (uVar8 < local_d0) {
        uVar6 = uVar8;
      }
      best_len = 0;
      best_len_code = 0;
      best_dist = 0;
      best_score = 4.0;
      bVar2 = HashLongestMatch<14,_5,_4>::FindLongestMatch
                        (hasher,local_e0,local_b0,dist_cache,uVar8 & 0xffffffff,local_f0 - uVar4,
                         uVar6,&best_len,&best_len_code,&best_dist,&best_score);
      if (bVar2) {
        local_60 = sVar3 + 4;
        local_50 = local_d8 + uVar4;
        lVar9 = -uVar4;
        lVar13 = 0;
        sVar10 = best_len;
        do {
          best_len = sVar10;
          uVar8 = local_58 + lVar9;
          cmd._0_8_ = best_len - 1;
          if (uVar8 < best_len - 1) {
            cmd._0_8_ = uVar8;
          }
          if (4 < quality) {
            cmd._0_8_ = 0;
          }
          best_len_code_2 = 0;
          best_dist_2 = 0;
          best_score_2 = 4.0;
          uVar4 = local_50 + lVar13;
          uVar12 = local_d0;
          if (uVar4 < local_d0) {
            uVar12 = uVar4;
          }
          bVar2 = HashLongestMatch<14,_5,_4>::FindLongestMatch
                            (hasher,local_e0,local_b0,dist_cache,uVar4 & 0xffffffff,uVar8,uVar12,
                             (size_t *)&cmd,&best_len_code_2,&best_dist_2,&best_score_2);
          if ((!bVar2) || (best_score_2 < best_score + 7.0)) {
            insertlen = sVar3 + lVar13;
            break;
          }
          sVar10._0_4_ = cmd.insert_len_;
          sVar10._4_4_ = cmd.copy_len_;
          best_len._0_4_ = cmd.insert_len_;
          best_len._4_4_ = cmd.copy_len_;
          best_len_code = best_len_code_2;
          best_dist = best_dist_2;
          best_score = best_score_2;
          lVar9 = lVar9 + -1;
          lVar13 = lVar13 + 1;
          insertlen = local_60;
        } while ((int)lVar13 != 4);
        sVar3 = best_len;
        lVar9 = -lVar9;
        uVar8 = lVar11 + lVar9;
        if (local_d0 <= (ulong)(lVar11 + lVar9)) {
          uVar8 = local_d0;
        }
        if (uVar8 < best_dist) {
LAB_0016bdfa:
          sVar10 = best_dist + 0xf;
LAB_0016bdfe:
          if (sVar10 != 0 && best_dist <= uVar8) {
            dist_cache[3] = dist_cache[2];
            *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
            *dist_cache = (int)best_dist;
          }
        }
        else {
          if (best_dist != (long)*dist_cache) {
            sVar10 = 1;
            if (((best_dist != (long)dist_cache[1]) &&
                (sVar10 = 2, best_dist != (long)dist_cache[2])) &&
               (sVar10 = 3, best_dist != (long)dist_cache[3])) {
              if (5 < best_dist && 3 < quality) {
                sVar10 = 4;
                do {
                  if ((best_dist ==
                       (long)(int)(&kDistanceCacheOffset)[sVar10] +
                       (long)dist_cache[(uint)(&kDistanceCacheIndex)[sVar10]]) &&
                     (*(ulong *)(ComputeDistanceCode(unsigned_long,unsigned_long,int,int_const*)::
                                 kLimits + sVar10 * 8) <= best_dist)) goto LAB_0016bdfe;
                  sVar10 = sVar10 + 1;
                } while (sVar10 != 0x10);
              }
              goto LAB_0016bdfa;
            }
            goto LAB_0016bdfe;
          }
          sVar10 = 0;
        }
        Command::Command(&cmd,insertlen,best_len,best_len_code,sVar10);
        local_e8->dist_extra_ = cmd.dist_extra_;
        local_e8->cmd_prefix_ = cmd.cmd_prefix_;
        local_e8->dist_prefix_ = cmd.dist_prefix_;
        local_e8->insert_len_ = cmd.insert_len_;
        local_e8->copy_len_ = cmd.copy_len_;
        local_e8->cmd_extra_ = cmd.cmd_extra_;
        *num_literals = *num_literals + insertlen;
        if (2 < best_len) {
          lVar13 = 0;
          do {
            uVar5 = (uint)(*(int *)(local_80 + lVar13 + lVar9) * 0x1e35a7bd) >> 0x12;
            uVar1 = hasher->num_[uVar5];
            *(int *)((long)hasher->buckets_[0] + (ulong)(uVar1 & 0x1f) * 4 + (ulong)(uVar5 << 7)) =
                 (int)local_78 + (int)lVar9 + (int)lVar13;
            hasher->num_[uVar5] = uVar1 + 1;
            lVar13 = lVar13 + 1;
          } while (best_len - 2 != lVar13);
        }
        uVar12 = local_68 + lVar9 + sVar3 * 2;
        local_e8 = local_e8 + 1;
        uVar8 = best_len + lVar9;
        sVar3 = 0;
      }
      else {
        sVar3 = sVar3 + 1;
        uVar8 = uVar4 + 1;
        if (uVar12 < uVar8) {
          if (local_70 + uVar12 < uVar8) {
            uVar6 = uVar4 + 0x11;
            if (local_90 < uVar4 + 0x11) {
              uVar6 = local_90;
            }
            if (uVar8 < uVar6) {
              iVar7 = (int)uVar4 + (int)local_d8;
              do {
                uVar5 = (uint)(*(int *)(local_e0 + uVar8) * 0x1e35a7bd) >> 0x12;
                uVar1 = hasher->num_[uVar5];
                *(int *)((long)hasher->buckets_[0] + (ulong)(uVar1 & 0x1f) * 4 + (ulong)(uVar5 << 7)
                        ) = iVar7;
                hasher->num_[uVar5] = uVar1 + 1;
                sVar3 = sVar3 + 4;
                uVar8 = uVar8 + 4;
                iVar7 = iVar7 + 4;
              } while (uVar8 < uVar6);
            }
          }
          else {
            uVar6 = uVar4 + 9;
            if (local_88 < uVar4 + 9) {
              uVar6 = local_88;
            }
            if (uVar8 < uVar6) {
              iVar7 = (int)uVar4 + (int)local_d8;
              do {
                uVar5 = (uint)(*(int *)(local_e0 + uVar8) * 0x1e35a7bd) >> 0x12;
                uVar1 = hasher->num_[uVar5];
                *(int *)((long)hasher->buckets_[0] + (ulong)(uVar1 & 0x1f) * 4 + (ulong)(uVar5 << 7)
                        ) = iVar7;
                hasher->num_[uVar5] = uVar1 + 1;
                sVar3 = sVar3 + 2;
                uVar8 = uVar8 + 2;
                iVar7 = iVar7 + 2;
              } while (uVar8 < uVar6);
            }
          }
        }
      }
      uVar4 = uVar8;
    } while (uVar8 + 3 < local_f0);
  }
  else {
    local_e8 = commands;
  }
  *last_insert_len = (local_f0 - uVar8) + sVar3;
  *num_commands = *num_commands + ((long)local_e8 - (long)commands >> 3) * -0x5555555555555555;
  return;
}

Assistant:

void CreateBackwardReferences(size_t num_bytes,
                              size_t position,
                              bool is_last,
                              const uint8_t* ringbuffer,
                              size_t ringbuffer_mask,
                              const int quality,
                              const int lgwin,
                              Hasher* hasher,
                              int* dist_cache,
                              size_t* last_insert_len,
                              Command* commands,
                              size_t* num_commands,
                              size_t* num_literals) {
  // Set maximum distance, see section 9.1. of the spec.
  const size_t max_backward_limit = (1 << lgwin) - 16;

  // Choose which init method is faster.
  // memset is about 100 times faster than hasher->InitForData().
  const size_t kMaxBytesForPartialHashInit = Hasher::kHashMapSize >> 7;
  if (position == 0 && is_last && num_bytes <= kMaxBytesForPartialHashInit) {
    hasher->InitForData(ringbuffer, num_bytes);
  } else {
    hasher->Init();
  }
  if (num_bytes >= 3 && position >= 3) {
    // Prepare the hashes for three last bytes of the last write.
    // These could not be calculated before, since they require knowledge
    // of both the previous and the current block.
    hasher->Store(&ringbuffer[(position - 3) & ringbuffer_mask],
                  static_cast<uint32_t>(position - 3));
    hasher->Store(&ringbuffer[(position - 2) & ringbuffer_mask],
                  static_cast<uint32_t>(position - 2));
    hasher->Store(&ringbuffer[(position - 1) & ringbuffer_mask],
                  static_cast<uint32_t>(position - 1));
  }
  const Command * const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  size_t i = position & ringbuffer_mask;
  const size_t i_diff = position - i;
  const size_t i_end = i + num_bytes;

  // For speed up heuristics for random data.
  const size_t random_heuristics_window_size = quality < 9 ? 64 : 512;
  size_t apply_random_heuristics = i + random_heuristics_window_size;

  // Minimum score to accept a backward reference.
  const int kMinScore = 4.0;

  while (i + Hasher::kHashTypeLength - 1 < i_end) {
    size_t max_length = i_end - i;
    size_t max_distance = std::min(i + i_diff, max_backward_limit);
    size_t best_len = 0;
    size_t best_len_code = 0;
    size_t best_dist = 0;
    double best_score = kMinScore;
    bool match_found = hasher->FindLongestMatch(
        ringbuffer, ringbuffer_mask,
        dist_cache, static_cast<uint32_t>(i + i_diff), max_length, max_distance,
        &best_len, &best_len_code, &best_dist, &best_score);
    if (match_found) {
      // Found a match. Let's look for something even better ahead.
      int delayed_backward_references_in_row = 0;
      for (;;) {
        --max_length;
        size_t best_len_2 =
            quality < 5 ? std::min(best_len - 1, max_length) : 0;
        size_t best_len_code_2 = 0;
        size_t best_dist_2 = 0;
        double best_score_2 = kMinScore;
        max_distance = std::min(i + i_diff + 1, max_backward_limit);
        match_found = hasher->FindLongestMatch(
            ringbuffer, ringbuffer_mask,
            dist_cache, static_cast<uint32_t>(i + i_diff + 1),
            max_length, max_distance,
            &best_len_2, &best_len_code_2, &best_dist_2, &best_score_2);
        double cost_diff_lazy = 7.0;
        if (match_found && best_score_2 >= best_score + cost_diff_lazy) {
          // Ok, let's just write one byte for now and start a match from the
            // next byte.
          ++i;
          ++insert_length;
          best_len = best_len_2;
          best_len_code = best_len_code_2;
          best_dist = best_dist_2;
          best_score = best_score_2;
          if (++delayed_backward_references_in_row < 4) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          i + 2 * best_len + random_heuristics_window_size;
      max_distance = std::min(i + i_diff, max_backward_limit);
      // The first 16 codes are special shortcodes, and the minimum offset is 1.
      size_t distance_code =
          ComputeDistanceCode(best_dist, max_distance, quality, dist_cache);
      if (best_dist <= max_distance && distance_code > 0) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = dist_cache[0];
        dist_cache[0] = static_cast<int>(best_dist);
      }
      Command cmd(insert_length, best_len, best_len_code, distance_code);
      *commands++ = cmd;
      *num_literals += insert_length;
      insert_length = 0;
      // Put the hash keys into the table, if there are enough
      // bytes left.
      for (size_t j = 2; j < best_len; ++j) {
        hasher->Store(&ringbuffer[i + j],
                      static_cast<uint32_t>(i + i_diff + j));
      }
      i += best_len;
    } else {
      ++insert_length;
      ++i;
      // If we have not seen matches for a long time, we can skip some
      // match lookups. Unsuccessful match lookups are very very expensive
      // and this kind of a heuristic speeds up compression quite
      // a lot.
      if (i > apply_random_heuristics) {
        // Going through uncompressible data, jump.
        if (i > apply_random_heuristics + 4 * random_heuristics_window_size) {
          // It is quite a long time since we saw a copy, so we assume
          // that this data is not compressible, and store hashes less
          // often. Hashes of non compressible data are less likely to
          // turn out to be useful in the future, too, so we store less of
          // them to not to flood out the hash table of good compressible
          // data.
          size_t i_jump = std::min(i + 16, i_end - 4);
          for (; i < i_jump; i += 4) {
            hasher->Store(ringbuffer + i, static_cast<uint32_t>(i + i_diff));
            insert_length += 4;
          }
        } else {
          size_t i_jump = std::min(i + 8, i_end - 3);
          for (; i < i_jump; i += 2) {
            hasher->Store(ringbuffer + i, static_cast<uint32_t>(i + i_diff));
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += i_end - i;
  *last_insert_len = insert_length;
  *num_commands += static_cast<size_t>(commands - orig_commands);
}